

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::synchronization::anon_unknown_0::PipelineCacheComputeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PipelineCacheComputeTestInstance *this)

{
  deUintptr *pdVar1;
  VkDevice pVVar2;
  ProgramCollection<vk::ProgramBinary> *this_00;
  Allocator *allocator;
  TestStatus *pTVar3;
  deUint32 dVar4;
  DeviceInterface *pDVar5;
  ostream *this_01;
  Unique<vk::Handle<(vk::HandleType)14>_> *ptr;
  ProgramBinary *binary;
  DescriptorSetLayoutBuilder *this_02;
  pointer puVar6;
  ThreadGroupThread *this_03;
  pointer puVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int shaderNdx;
  uint uVar11;
  bool bVar12;
  allocator<char> local_379;
  VkDevice local_378;
  TestStatus *local_370;
  DeviceInterface *local_368;
  MultiQueues *local_360;
  MovePtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
  local_358;
  ThreadGroup threads;
  vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  pipelineInfo;
  ShaderModuleVector shaderCompModules;
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  shaderStageInfos;
  Buffer resultBuffer;
  MovePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  queues;
  Move<vk::Handle<(vk::HandleType)15>_> pipelineCache;
  string local_210;
  Move<vk::Handle<(vk::HandleType)18>_> pipeline;
  undefined1 local_1d0 [40];
  VkPipelineCacheCreateInfo pipelineCacheInfo;
  
  local_370 = __return_storage_ptr__;
  local_368 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pipelineCacheInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  createQueues(&queues,(this->super_TestInstance).m_context,&pipelineCacheInfo.sType);
  local_360 = queues.
              super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
              .m_data.ptr;
  pVVar2 = ((queues.
             super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
             .m_data.ptr)->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  pDVar5 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  shaderCompModules.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderCompModules.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  shaderCompModules.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378 = pVVar2;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::resize(&shaderCompModules,
           (long)(this->m_shadersExecutions).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->m_shadersExecutions).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2);
  lVar10 = 0;
  for (lVar8 = 0;
      lVar8 < (int)((ulong)((long)(this->m_shadersExecutions).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_shadersExecutions).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2); lVar8 = lVar8 + 1)
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pipelineCacheInfo);
    this_01 = std::operator<<((ostream *)&pipelineCacheInfo,"compute_");
    std::ostream::operator<<(this_01,(int)lVar8);
    ptr = (Unique<vk::Handle<(vk::HandleType)14>_> *)operator_new(0x20);
    this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
    std::__cxx11::stringbuf::str();
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&descriptorSetLayout)
    ;
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultBuffer,pDVar5,local_378,binary,0);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
         resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
    ;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
         resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
         m_allocator;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
         m_internal;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
         resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
         m_deviceIface;
    resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0
    ;
    resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)0x0;
    resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)
               &pipelineLayout,ptr);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)
               ((long)&(shaderCompModules.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar10),
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)
               &pipelineLayout);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)
               &pipelineLayout);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&resultBuffer);
    std::__cxx11::string::~string((string *)&descriptorSetLayout);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pipelineCacheInfo);
    lVar10 = lVar10 + 0x10;
  }
  allocator = (local_360->m_allocator).
              super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr;
  makeBufferCreateInfo((VkBufferCreateInfo *)&pipelineCacheInfo,0x40,0x20);
  synchronization::Buffer::Buffer
            (&resultBuffer,local_368,local_378,allocator,(VkBufferCreateInfo *)&pipelineCacheInfo,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&pipelineCacheInfo);
  this_02 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&pipelineCacheInfo,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar5 = local_368;
  pVVar2 = local_378;
  ::vk::DescriptorSetLayoutBuilder::build(&descriptorSetLayout,this_02,local_368,local_378,0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&pipelineCacheInfo);
  makePipelineLayout(&pipelineLayout,pDVar5,pVVar2,
                     (VkDescriptorSetLayout)
                     descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                     object.m_internal);
  shaderStageInfos.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pipelineCacheInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  pipelineCacheInfo.pNext = (void *)0x0;
  pipelineCacheInfo.flags = 0;
  pipelineCacheInfo._20_4_ = 0x20;
  pipelineCacheInfo.pInitialData = "main";
  shaderStageInfos.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderStageInfos.
  super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar8 = 0;
  lVar10 = 0;
  while( true ) {
    puVar7 = (this->m_shadersExecutions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (this->m_shadersExecutions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)puVar6 - (long)puVar7) >> 2) <= lVar10) break;
    pipelineCacheInfo.initialDataSize =
         **(deUintptr **)
           ((long)&(shaderCompModules.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8);
    std::
    vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
    ::push_back(&shaderStageInfos,(value_type *)&pipelineCacheInfo);
    lVar10 = lVar10 + 1;
    lVar8 = lVar8 + 0x10;
  }
  pipelineInfo.
  super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pipelineCacheInfo.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  pipelineCacheInfo.pNext = (void *)0x0;
  pipelineCacheInfo._16_8_ = pipelineCacheInfo._16_8_ & 0xffffffff00000000;
  pipelineInfo.
  super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipelineInfo.
  super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar8 = 0;
  for (lVar10 = 0; pDVar5 = local_368, pVVar2 = local_378,
      lVar10 < (int)((ulong)((long)puVar6 - (long)puVar7) >> 2); lVar10 = lVar10 + 1) {
    pdVar1 = (deUintptr *)
             ((long)&(shaderStageInfos.
                      super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sType + lVar8);
    pipelineCacheInfo.initialDataSize = *pdVar1;
    pipelineCacheInfo.pInitialData = (void *)pdVar1[1];
    std::vector<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>::
    push_back(&pipelineInfo,(value_type *)&pipelineCacheInfo);
    puVar7 = (this->m_shadersExecutions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (this->m_shadersExecutions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = lVar8 + 0x30;
  }
  pipelineCacheInfo.pNext = (void *)0x0;
  pipelineCacheInfo.flags = 0;
  pipelineCacheInfo._20_4_ = 0;
  pipelineCacheInfo.initialDataSize = 0;
  pipelineCacheInfo.pInitialData = (void *)0x0;
  pipelineCacheInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
  pipelineCacheInfo._4_4_ = 0;
  ::vk::createPipelineCache
            (&pipelineCache,local_368,local_378,&pipelineCacheInfo,(VkAllocationCallbacks *)0x0);
  ::vk::createComputePipeline
            (&pipeline,pDVar5,pVVar2,
             (VkPipelineCache)
             pipelineCache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
             pipelineInfo.
             super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
             ._M_impl.super__Vector_impl_data._M_start,(VkAllocationCallbacks *)0x0);
  dVar4 = deGetNumAvailableLogicalCores();
  uVar9 = 0x20;
  if (dVar4 < 0x20) {
    uVar9 = dVar4;
  }
  uVar11 = 4;
  if (4 < uVar9) {
    uVar11 = uVar9;
  }
  threads.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  threads.m_threads.
  super__Vector_base<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  executeComputePipeline
            ((TestStatus *)local_1d0,(this->super_TestInstance).m_context,(VkPipeline *)&pipeline,
             (VkPipelineLayout *)&pipelineLayout,(VkDescriptorSetLayout *)&descriptorSetLayout,
             local_360,
             (this->m_shadersExecutions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
    this_03 = (ThreadGroupThread *)operator_new(0xa0);
    ThreadGroupThread::ThreadGroupThread
              (this_03,(this->super_TestInstance).m_context,
               (VkPipelineCache)
               pipelineCache.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal
               ,(VkPipelineLayout *)&pipelineLayout,(VkDescriptorSetLayout *)&descriptorSetLayout,
               local_360,&this->m_shadersExecutions);
    (this_03->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00c0b078;
    this_03[1].super_Thread._vptr_Thread = (_func_int **)&pipelineInfo;
    local_358.
    super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_03;
    ThreadGroup::add(&threads,&local_358);
    if (local_358.
        super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_358.
          super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_358.
      super_UniqueBase<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
  }
  ThreadGroup::run(local_370,&threads);
  pTVar3 = local_370;
  if (local_370->m_code == QP_TEST_RESULT_PASS) {
    std::__cxx11::string::~string((string *)&local_370->m_description);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Passed",&local_379);
    tcu::TestStatus::pass(pTVar3,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  pTVar3 = local_370;
  ThreadGroup::~ThreadGroup(&threads);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            (&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase
            (&pipelineCache.super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  std::
  _Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>::
  ~_Vector_base(&pipelineInfo.
                 super__Vector_base<vk::VkComputePipelineCreateInfo,_std::allocator<vk::VkComputePipelineCreateInfo>_>
               );
  std::
  _Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::~_Vector_base(&shaderStageInfos.
                   super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                 );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            (&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            (&descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  synchronization::Buffer::~Buffer(&resultBuffer);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector(&shaderCompModules);
  de::details::
  UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  ::~UniqueBase(&queues.
                 super_UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
               );
  return pTVar3;
}

Assistant:

TestStatus	iterate								(void)
	{
		const DeviceInterface&					vk					= m_context.getDeviceInterface();
		MovePtr<MultiQueues>					queues				= createQueues(m_context, VK_QUEUE_COMPUTE_BIT);
		const VkDevice							device				= queues->getDevice();
		ShaderModuleVector						shaderCompModules	= addShaderModules(device);
		Buffer									resultBuffer		(vk, device, *queues->m_allocator, makeBufferCreateInfo(BUFFER_SIZE, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);
		const Move<VkDescriptorSetLayout>		descriptorSetLayout	(DescriptorSetLayoutBuilder()
																		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
																		.build(vk, device));
		const Move<VkPipelineLayout>			pipelineLayout		(makePipelineLayout(vk, device, *descriptorSetLayout));
		vector<VkPipelineShaderStageCreateInfo>	shaderStageInfos	= addShaderStageInfo(shaderCompModules);
		vector<VkComputePipelineCreateInfo>		pipelineInfo		= addPipelineInfo(*pipelineLayout, shaderStageInfos);
		const VkPipelineCacheCreateInfo			pipelineCacheInfo	=
																	{
																		VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO,	// VkStructureType             sType;
																		DE_NULL,										// const void*                 pNext;
																		0u,												// VkPipelineCacheCreateFlags  flags;
																		0u,												// deUintptr                   initialDataSize;
																		DE_NULL,										// const void*                 pInitialData;
																	};
		Move<VkPipelineCache>					pipelineCache		= createPipelineCache(vk, device, &pipelineCacheInfo);
		Move<VkPipeline>						pipeline			= createComputePipeline(vk, device, *pipelineCache, &pipelineInfo[0]);
		const deUint32							numThreads			= clamp(deGetNumAvailableLogicalCores(), 4u, 32u);
		ThreadGroup								threads;

		executeComputePipeline(m_context, *pipeline, *pipelineLayout, *descriptorSetLayout, *queues, m_shadersExecutions[0]);

		for (deUint32 ndx = 0; ndx < numThreads; ++ndx)
			threads.add(MovePtr<ThreadGroupThread>(new CreateComputeThread(
				m_context, *pipelineCache, pipelineInfo, *pipelineLayout, *descriptorSetLayout, *queues, m_shadersExecutions)));

		{
			TestStatus thread_result = threads.run();
			if(thread_result.getCode())
			{
				return thread_result;
			}
		}
		return TestStatus::pass("Passed");
	}